

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  ParenthesizedPropertyExprSyntax *pPVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  SequenceMatchListSyntax *in_stack_ffffffffffffffb0;
  
  TVar3 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x597d13);
  deepClone<slang::syntax::PropertyExprSyntax>
            ((PropertyExprSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x30))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x30))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x30))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x30))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::SequenceMatchListSyntax>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pPVar2 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedPropertyExprSyntax,slang::parsing::Token,slang::syntax::PropertyExprSyntax&,slang::syntax::SequenceMatchListSyntax*,slang::parsing::Token>
                     (unaff_retaddr,(Token *)__fn,(PropertyExprSyntax *)__child_stack,
                      (SequenceMatchListSyntax **)TVar3.info,TVar3._0_8_);
  return (int)pPVar2;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedPropertyExprSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc),
        node.matchList ? deepClone(*node.matchList, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}